

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O1

_Bool ggml_gallocr_reserve_n
                (ggml_gallocr_t galloc,ggml_cgraph *graph,int *node_buffer_ids,int *leaf_buffer_ids)

{
  ggml_hash_set *hash_set;
  ggml_dyn_tallocr **ppgVar1;
  ggml_dyn_tallocr *pgVar2;
  ggml_tensor *pgVar3;
  ggml_tensor *pgVar4;
  ulong size;
  hash_node *phVar5;
  node_alloc *pnVar6;
  leaf_alloc *plVar7;
  size_t sVar8;
  ggml_backend_buffer_t pgVar9;
  char *pcVar10;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  long lVar14;
  node_alloc *pnVar15;
  ggml_tensor *view_src;
  ggml_tensor *t;
  int *piVar16;
  int j;
  long lVar17;
  long local_58;
  ggml_hash_set local_48;
  
  uVar11 = (long)graph->n_leafs + (long)graph->n_nodes;
  uVar11 = (uVar11 >> 2) + uVar11;
  hash_set = &galloc->hash_set;
  if ((galloc->hash_set).size < uVar11) {
    ggml_hash_set_free(hash_set);
    ggml_hash_set_new(&local_48,uVar11);
    (galloc->hash_set).keys = local_48.keys;
    hash_set->size = local_48.size;
    (galloc->hash_set).used = local_48.used;
    if ((galloc->hash_set).keys == (ggml_tensor **)0x0) {
      pcVar10 = "galloc->hash_set.keys != NULL";
      iVar12 = 0x2aa;
      goto LAB_00124449;
    }
    free(galloc->hash_values);
    phVar5 = (hash_node *)malloc((galloc->hash_set).size << 5);
    galloc->hash_values = phVar5;
    if (phVar5 == (hash_node *)0x0) {
      pcVar10 = "galloc->hash_values != NULL";
      iVar12 = 0x2ae;
      goto LAB_00124449;
    }
  }
  iVar12 = galloc->n_buffers;
  if (0 < (long)iVar12) {
    ppgVar1 = galloc->buf_tallocs;
    lVar14 = 0;
    do {
      pgVar2 = ppgVar1[lVar14];
      pgVar2->n_free_blocks = 1;
      pgVar2->free_blocks[0].offset = 0;
      pgVar2->free_blocks[0].size = 0x7fffffffffffffff;
      pgVar2->max_size = 0;
      lVar14 = lVar14 + 1;
    } while (iVar12 != lVar14);
  }
  ggml_hash_set_reset(hash_set);
  memset(galloc->hash_values,0,(galloc->hash_set).size << 5);
  if (0 < graph->n_leafs) {
    lVar14 = 0;
    do {
      iVar12 = 0;
      if (leaf_buffer_ids != (int *)0x0) {
        iVar12 = leaf_buffer_ids[lVar14];
      }
      ggml_gallocr_allocate_node(galloc,graph->leafs[lVar14],iVar12);
      lVar14 = lVar14 + 1;
    } while (lVar14 < graph->n_leafs);
  }
  if (0 < graph->n_nodes) {
    lVar14 = 0;
    do {
      pgVar3 = graph->nodes[lVar14];
      if ((pgVar3->view_src != (ggml_tensor *)0x0) && (pgVar3->op != GGML_OP_NONE)) {
        phVar5 = ggml_gallocr_hash_get(galloc,pgVar3->view_src);
        phVar5->n_views = phVar5->n_views + 1;
      }
      if ((pgVar3->flags & 1) != 0) {
        if (node_buffer_ids == (int *)0x0) {
          iVar12 = 0;
        }
        else {
          iVar12 = node_buffer_ids[lVar14];
        }
        ggml_gallocr_allocate_node(galloc,graph->nodes[lVar14],iVar12);
      }
      lVar17 = 0;
      do {
        pgVar4 = pgVar3->src[lVar17];
        if (pgVar4 != (ggml_tensor *)0x0) {
          phVar5 = ggml_gallocr_hash_get(galloc,pgVar4);
          phVar5->n_children = phVar5->n_children + 1;
          if ((pgVar4->flags & 1) != 0) {
            if (node_buffer_ids == (int *)0x0) {
              iVar12 = 0;
            }
            else {
              iVar12 = node_buffer_ids[lVar14];
            }
            ggml_gallocr_allocate_node(galloc,pgVar4,iVar12);
          }
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 10);
      lVar14 = lVar14 + 1;
    } while (lVar14 < graph->n_nodes);
  }
  if (0 < graph->n_nodes) {
    lVar14 = 0;
    do {
      iVar12 = 0;
      if (node_buffer_ids != (int *)0x0) {
        iVar12 = node_buffer_ids[lVar14];
      }
      pgVar3 = graph->nodes[lVar14];
      lVar17 = 0x13;
      do {
        if ((ggml_tensor *)pgVar3->ne[lVar17 + -2] != (ggml_tensor *)0x0) {
          ggml_gallocr_allocate_node(galloc,(ggml_tensor *)pgVar3->ne[lVar17 + -2],iVar12);
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 0x1d);
      ggml_gallocr_allocate_node(galloc,pgVar3,iVar12);
      lVar17 = 0;
      do {
        pgVar4 = pgVar3->src[lVar17];
        if (pgVar4 != (ggml_tensor *)0x0) {
          phVar5 = ggml_gallocr_hash_get(galloc,pgVar4);
          phVar5->n_children = phVar5->n_children + -1;
          if ((phVar5->n_children == 0) && (phVar5->n_views == 0)) {
            t = pgVar4->view_src;
            if (t == (ggml_tensor *)0x0) {
              t = pgVar4;
              if (phVar5->allocated == true) goto LAB_0012409c;
            }
            else {
              phVar5 = ggml_gallocr_hash_get(galloc,t);
              piVar16 = &phVar5->n_views;
              *piVar16 = *piVar16 + -1;
              if (((*piVar16 == 0) && (phVar5->n_children == 0)) && (phVar5->allocated != false)) {
LAB_0012409c:
                ggml_gallocr_free_node(galloc,t);
              }
            }
          }
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != 10);
      lVar14 = lVar14 + 1;
    } while (lVar14 < graph->n_nodes);
  }
  if (galloc->n_nodes < graph->n_nodes) {
    free(galloc->node_allocs);
    pnVar6 = (node_alloc *)calloc((long)graph->n_nodes,0x108);
    galloc->node_allocs = pnVar6;
    if (pnVar6 == (node_alloc *)0x0) {
      pcVar10 = "galloc->node_allocs != NULL";
      iVar12 = 0x2bd;
      goto LAB_00124449;
    }
  }
  iVar12 = graph->n_nodes;
  galloc->n_nodes = iVar12;
  if (0 < iVar12) {
    local_58 = 0x18;
    lVar14 = 0;
    do {
      pgVar3 = graph->nodes[lVar14];
      pnVar6 = galloc->node_allocs;
      pnVar15 = pnVar6 + lVar14;
      if ((pgVar3->view_src == (ggml_tensor *)0x0) && (pgVar3->data == (void *)0x0)) {
        phVar5 = ggml_gallocr_hash_get(galloc,pgVar3);
        iVar12 = phVar5->buffer_id;
        (pnVar15->dst).buffer_id = iVar12;
        (pnVar15->dst).offset = phVar5->offset;
        sVar8 = ggml_backend_buft_get_alloc_size(galloc->bufts[iVar12],pgVar3);
      }
      else {
        (pnVar15->dst).buffer_id = -1;
        (pnVar15->dst).offset = 0xffffffffffffffff;
        sVar8 = 0;
      }
      (pnVar15->dst).size_max = sVar8;
      piVar16 = (int *)((long)&(((node_alloc *)(pnVar6->src + -1))->dst).buffer_id + local_58);
      lVar17 = 0;
      do {
        pgVar4 = pgVar3->src[lVar17];
        if (((pgVar4 == (ggml_tensor *)0x0) || (pgVar4->view_src != (ggml_tensor *)0x0)) ||
           (pgVar4->data != (void *)0x0)) {
          *piVar16 = -1;
          piVar16[2] = -1;
          piVar16[3] = -1;
          sVar8 = 0;
        }
        else {
          phVar5 = ggml_gallocr_hash_get(galloc,pgVar4);
          iVar12 = phVar5->buffer_id;
          *piVar16 = iVar12;
          *(size_t *)(piVar16 + 2) = phVar5->offset;
          sVar8 = ggml_backend_buft_get_alloc_size(galloc->bufts[iVar12],pgVar4);
        }
        *(size_t *)(piVar16 + 4) = sVar8;
        lVar17 = lVar17 + 1;
        piVar16 = piVar16 + 6;
      } while (lVar17 != 10);
      lVar14 = lVar14 + 1;
      local_58 = local_58 + 0x108;
    } while (lVar14 < graph->n_nodes);
  }
  if (galloc->n_leafs < graph->n_leafs) {
    free(galloc->leaf_allocs);
    plVar7 = (leaf_alloc *)calloc((long)graph->n_leafs,0x18);
    galloc->leaf_allocs = plVar7;
    if (plVar7 == (leaf_alloc *)0x0) {
      pcVar10 = "galloc->leaf_allocs != NULL";
      iVar12 = 0x2de;
LAB_00124449:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-alloc.c"
                 ,iVar12,"GGML_ASSERT(%s) failed",pcVar10);
    }
  }
  iVar12 = graph->n_leafs;
  galloc->n_leafs = iVar12;
  if (0 < iVar12) {
    lVar17 = 0;
    lVar14 = 0;
    do {
      pgVar3 = graph->leafs[lVar14];
      phVar5 = ggml_gallocr_hash_get(galloc,pgVar3);
      if ((pgVar3->view_src == (ggml_tensor *)0x0) && (pgVar3->data == (void *)0x0)) {
        iVar12 = phVar5->buffer_id;
        plVar7 = galloc->leaf_allocs;
        *(int *)((long)&(plVar7->leaf).buffer_id + lVar17) = iVar12;
        *(size_t *)((long)&(plVar7->leaf).offset + lVar17) = phVar5->offset;
        sVar8 = ggml_backend_buft_get_alloc_size(galloc->bufts[iVar12],pgVar3);
        plVar7 = galloc->leaf_allocs;
      }
      else {
        plVar7 = galloc->leaf_allocs;
        *(undefined4 *)((long)&(plVar7->leaf).buffer_id + lVar17) = 0xffffffff;
        *(undefined8 *)((long)&(plVar7->leaf).offset + lVar17) = 0xffffffffffffffff;
        sVar8 = 0;
      }
      *(size_t *)((long)&(plVar7->leaf).size_max + lVar17) = sVar8;
      lVar14 = lVar14 + 1;
      lVar17 = lVar17 + 0x18;
    } while (lVar14 < graph->n_leafs);
  }
  bVar13 = galloc->n_buffers < 1;
  if (0 < galloc->n_buffers) {
    lVar14 = 0;
    do {
      if (lVar14 != 0) {
        lVar17 = 0;
        do {
          if (galloc->buf_tallocs[lVar17] == galloc->buf_tallocs[lVar14]) {
            galloc->buffers[lVar14] = galloc->buffers[lVar17];
            break;
          }
          lVar17 = lVar17 + 1;
        } while (lVar14 != lVar17);
      }
      if (galloc->buffers[lVar14] == (ggml_backend_buffer_t)0x0) {
        uVar11 = 0;
      }
      else {
        uVar11 = ggml_backend_buffer_get_size(galloc->buffers[lVar14]);
      }
      size = galloc->buf_tallocs[lVar14]->max_size;
      if ((uVar11 < size) || (galloc->buffers[lVar14] == (ggml_backend_buffer_t)0x0)) {
        ggml_backend_buffer_free(galloc->buffers[lVar14]);
        pgVar9 = ggml_backend_buft_alloc_buffer(galloc->bufts[lVar14],size);
        galloc->buffers[lVar14] = pgVar9;
        if (galloc->buffers[lVar14] == (ggml_backend_buffer_t)0x0) {
          pcVar10 = ggml_backend_buft_name(galloc->bufts[lVar14]);
          ggml_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to allocate %s buffer of size %zu\n",
                            "ggml_gallocr_reserve_n",pcVar10,size);
          return bVar13;
        }
        ggml_backend_buffer_set_usage(galloc->buffers[lVar14],GGML_BACKEND_BUFFER_USAGE_COMPUTE);
      }
      lVar14 = lVar14 + 1;
      bVar13 = galloc->n_buffers <= lVar14;
    } while (lVar14 < galloc->n_buffers);
  }
  return bVar13;
}

Assistant:

bool ggml_gallocr_reserve_n(ggml_gallocr_t galloc, struct ggml_cgraph * graph, const int * node_buffer_ids, const int * leaf_buffer_ids) {
    size_t min_hash_size = graph->n_nodes + graph->n_leafs;
    // add 25% margin to avoid hash collisions
    min_hash_size += min_hash_size / 4;

    // initialize hash table
    if (galloc->hash_set.size < min_hash_size) {
        ggml_hash_set_free(&galloc->hash_set);
        galloc->hash_set = ggml_hash_set_new(min_hash_size);
        GGML_ASSERT(galloc->hash_set.keys != NULL);

        free(galloc->hash_values);
        galloc->hash_values = malloc(sizeof(struct hash_node) * galloc->hash_set.size);
        GGML_ASSERT(galloc->hash_values != NULL);
    }

    // reset allocators
    for (int i = 0; i < galloc->n_buffers; i++) {
        ggml_dyn_tallocr_reset(galloc->buf_tallocs[i]);
    }

    // allocate in hash table
    ggml_gallocr_alloc_graph_impl(galloc, graph, node_buffer_ids, leaf_buffer_ids);

    // set the node_allocs from the hash table
    if (galloc->n_nodes < graph->n_nodes) {
        free(galloc->node_allocs);
        galloc->node_allocs = calloc(graph->n_nodes, sizeof(struct node_alloc));
        GGML_ASSERT(galloc->node_allocs != NULL);
    }
    galloc->n_nodes = graph->n_nodes;
    for (int i = 0; i < graph->n_nodes; i++) {
        struct ggml_tensor * node = graph->nodes[i];
        struct node_alloc * node_alloc = &galloc->node_allocs[i];
        if (node->view_src || node->data) {
            node_alloc->dst.buffer_id = -1;
            node_alloc->dst.offset = SIZE_MAX;
            node_alloc->dst.size_max = 0;
        } else {
            struct hash_node * hn = ggml_gallocr_hash_get(galloc, node);
            node_alloc->dst.buffer_id = hn->buffer_id;
            node_alloc->dst.offset    = hn->offset;
            node_alloc->dst.size_max  = ggml_backend_buft_get_alloc_size(galloc->bufts[hn->buffer_id], node);
        }
        for (int j = 0; j < GGML_MAX_SRC; j++) {
            struct ggml_tensor * src = node->src[j];
            if (!src || src->view_src || src->data) {
                node_alloc->src[j].buffer_id = -1;
                node_alloc->src[j].offset = SIZE_MAX;
                node_alloc->src[j].size_max = 0;
            } else {
                struct hash_node * hn = ggml_gallocr_hash_get(galloc, src);
                node_alloc->src[j].buffer_id = hn->buffer_id;
                node_alloc->src[j].offset   = hn->offset;
                node_alloc->src[j].size_max = ggml_backend_buft_get_alloc_size(galloc->bufts[hn->buffer_id], src);
            }
        }
    }
    if (galloc->n_leafs < graph->n_leafs) {
        free(galloc->leaf_allocs);
        galloc->leaf_allocs = calloc(graph->n_leafs, sizeof(galloc->leaf_allocs[0]));
        GGML_ASSERT(galloc->leaf_allocs != NULL);
    }
    galloc->n_leafs = graph->n_leafs;
    for (int i = 0; i < graph->n_leafs; i++) {
        struct ggml_tensor * leaf = graph->leafs[i];
        struct hash_node * hn = ggml_gallocr_hash_get(galloc, leaf);
        if (leaf->view_src || leaf->data) {
            galloc->leaf_allocs[i].leaf.buffer_id = -1;
            galloc->leaf_allocs[i].leaf.offset = SIZE_MAX;
            galloc->leaf_allocs[i].leaf.size_max = 0;
        } else {
            galloc->leaf_allocs[i].leaf.buffer_id = hn->buffer_id;
            galloc->leaf_allocs[i].leaf.offset = hn->offset;
            galloc->leaf_allocs[i].leaf.size_max = ggml_backend_buft_get_alloc_size(galloc->bufts[hn->buffer_id], leaf);
        }
    }

    // reallocate buffers if needed
    for (int i = 0; i < galloc->n_buffers; i++) {
        // if the buffer type is used multiple times, we reuse the same buffer
        for (int j = 0; j < i; j++) {
            if (galloc->buf_tallocs[j] == galloc->buf_tallocs[i]) {
                galloc->buffers[i] = galloc->buffers[j];
                break;
            }
        }

        size_t cur_size = galloc->buffers[i] ? ggml_backend_buffer_get_size(galloc->buffers[i]) : 0;
        size_t new_size = ggml_dyn_tallocr_max_size(galloc->buf_tallocs[i]);

        // even if there are no tensors allocated in this buffer, we still need to allocate it to initialize views
        if (new_size > cur_size || galloc->buffers[i] == NULL) {
#ifndef NDEBUG
            GGML_LOG_DEBUG("%s: reallocating %s buffer from size %.02f MiB to %.02f MiB\n", __func__, ggml_backend_buft_name(galloc->bufts[i]), cur_size / 1024.0 / 1024.0, new_size / 1024.0 / 1024.0);
#endif

            ggml_backend_buffer_free(galloc->buffers[i]);
            galloc->buffers[i] = ggml_backend_buft_alloc_buffer(galloc->bufts[i], new_size);
            if (galloc->buffers[i] == NULL) {
                GGML_LOG_ERROR("%s: failed to allocate %s buffer of size %zu\n", __func__, ggml_backend_buft_name(galloc->bufts[i]), new_size);
                return false;
            }
            ggml_backend_buffer_set_usage(galloc->buffers[i], GGML_BACKEND_BUFFER_USAGE_COMPUTE);
        }
    }

    return true;
}